

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::ConvolutionLayer2D
          (ConvolutionLayer2D<3UL> *this,size_t imageWidth,size_t imageHeight)

{
  valarray<float> *pvVar1;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30 [4];
  size_t local_20;
  size_t imageHeight_local;
  size_t imageWidth_local;
  ConvolutionLayer2D<3UL> *this_local;
  
  local_20 = imageHeight;
  imageHeight_local = imageWidth;
  imageWidth_local = (size_t)this;
  ABackpropLayer::ABackpropLayer(&this->super_ABackpropLayer);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__002ba658;
  this->inputWidth = imageHeight_local;
  this->inputHeight = local_20;
  this->inputSize = this->inputWidth * this->inputHeight;
  this->outputWidth = imageHeight_local - 2;
  this->outputHeight = local_20 - 2;
  this->outputSize = this->outputWidth * this->outputHeight;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_30[0] = 0.0;
  std::valarray<float>::valarray(pvVar1,local_30,9);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weights,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_34 = 0.0;
  std::valarray<float>::valarray(pvVar1,&local_34,1);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->bias,pvVar1);
  local_38 = 0.0;
  std::valarray<float>::valarray(&this->localGrad,&local_38,this->outputSize);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_3c = 0.0;
  std::valarray<float>::valarray(pvVar1,&local_3c,9);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weightSensitivity,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_40 = 0.0;
  std::valarray<float>::valarray(pvVar1,&local_40,1);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->biasSensitivity,pvVar1);
  local_44 = 0.0;
  std::valarray<float>::valarray(&this->propagatedErrors,&local_44,this->inputSize);
  std::shared_ptr<notch::core::ALearningPolicy>::shared_ptr(&this->policy);
  return;
}

Assistant:

ConvolutionLayer2D(size_t imageWidth, size_t imageHeight)
        : inputWidth(imageWidth), inputHeight(imageHeight),
          inputSize(inputWidth * inputHeight),
          outputWidth(imageWidth - kernelSize + 1),
          outputHeight(imageHeight - kernelSize + 1),
          outputSize(outputWidth * outputHeight),
          weights(new Array(0.0, kernelSize*kernelSize)),
          bias(new Array(0.0, 1)),
          localGrad(0.0, outputSize),
          weightSensitivity(new Array(0.0, kernelSize*kernelSize)),
          biasSensitivity(new Array(0.0, 1)),
          propagatedErrors(0.0, inputSize)
          {}